

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O1

spv_result_t
spvOperandTableValueLookup
          (spv_target_env param_1,spv_operand_table table,spv_operand_type_t type,uint32_t value,
          spv_operand_desc *pEntry)

{
  uint uVar1;
  spv_operand_desc_group_t *psVar2;
  spv_operand_desc_t *psVar3;
  bool bVar4;
  spv_result_t sVar5;
  ulong uVar6;
  ulong uVar7;
  spv_operand_desc_t *psVar8;
  difference_type __d;
  ulong uVar9;
  ulong uVar11;
  ulong uVar10;
  
  if (table == (spv_operand_table)0x0) {
    sVar5 = SPV_ERROR_INVALID_TABLE;
  }
  else {
    if (pEntry == (spv_operand_desc *)0x0) {
      return SPV_ERROR_INVALID_POINTER;
    }
    uVar1 = table->count;
    sVar5 = SPV_ERROR_INVALID_LOOKUP;
    if ((ulong)uVar1 != 0) {
      uVar7 = 0;
      while( true ) {
        psVar2 = table->types;
        bVar4 = false;
        if (psVar2[uVar7].type == type) {
          psVar3 = psVar2[uVar7].entries;
          uVar6 = (ulong)psVar2[uVar7].count;
          psVar8 = psVar3;
          uVar10 = uVar6;
          if (uVar6 != 0) {
            do {
              uVar9 = uVar10 >> 1;
              uVar11 = uVar9;
              if (psVar8[uVar9].value < value) {
                uVar11 = ~uVar9 + uVar10;
                psVar8 = psVar8 + uVar9 + 1;
              }
              uVar10 = uVar11;
            } while (0 < (long)uVar11);
          }
          bVar4 = false;
          if ((psVar8 != psVar3 + uVar6) && (psVar8->value == value)) {
            *pEntry = psVar8;
            bVar4 = true;
          }
        }
        if (bVar4) break;
        uVar7 = uVar7 + 1;
        if (uVar7 == uVar1) {
          return SPV_ERROR_INVALID_LOOKUP;
        }
      }
      return SPV_SUCCESS;
    }
  }
  return sVar5;
}

Assistant:

spv_result_t spvOperandTableValueLookup(spv_target_env,
                                        const spv_operand_table table,
                                        const spv_operand_type_t type,
                                        const uint32_t value,
                                        spv_operand_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  spv_operand_desc_t needle = {"", value,   0,  nullptr, 0,  nullptr,
                               0,  nullptr, {}, ~0u,     ~0u};

  auto comp = [](const spv_operand_desc_t& lhs, const spv_operand_desc_t& rhs) {
    return lhs.value < rhs.value;
  };

  for (uint64_t typeIndex = 0; typeIndex < table->count; ++typeIndex) {
    const auto& group = table->types[typeIndex];
    if (type != group.type) continue;

    const auto beg = group.entries;
    const auto end = group.entries + group.count;

    // Assumes the underlying table is already sorted ascendingly according to
    // opcode value.
    auto it = std::lower_bound(beg, end, needle, comp);
    if (it != end && it->value == value) {
      // The current operand is considered available as long as
      // it is in the grammar.  It might not be *valid* to use,
      // but that should be checked by the validator, not by parsing.
      *pEntry = it;
      return SPV_SUCCESS;
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}